

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanced_geometry.cpp
# Opt level: O2

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"instanced_geometry",&local_31);
  TutorialApplication::TutorialApplication(&this->super_TutorialApplication,&local_30,1,0x200,0x200)
  ;
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_TutorialApplication).super_Application._vptr_Application =
       (_func_int **)&PTR__TutorialApplication_002a4cf0;
  *(undefined8 *)&(this->super_TutorialApplication).camera.from.field_0 = 0x4020000040200000;
  *(undefined8 *)((long)&(this->super_TutorialApplication).camera.from.field_0 + 8) = 0x40200000;
  *(undefined8 *)&(this->super_TutorialApplication).camera.to.field_0 = 0;
  *(undefined8 *)((long)&(this->super_TutorialApplication).camera.to.field_0 + 8) = 0;
  return;
}

Assistant:

Tutorial()
      : TutorialApplication(NAME, FEATURES) 
    {
      /* set default camera */
      camera.from = Vec3fa(2.5f,2.5f,2.5f);
      camera.to   = Vec3fa(0.0f,0.0f,0.0f);
    }